

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::visit(Executor *this,UnaryNode *node)

{
  UnaryOperator UVar1;
  ExpressionNode *pEVar2;
  Value *pVVar3;
  mapped_type *__rhs;
  Value *pVVar4;
  Executor *this_00;
  NumberValueAnalyser analyser;
  undefined8 local_68;
  undefined **local_58;
  undefined1 local_50;
  _Map_pointer local_48;
  char local_40;
  TypeName local_34;
  
  pEVar2 = (node->term_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,this);
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_34 = F32;
  __rhs = std::__detail::
          _Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&UnaryOperationNames_abi_cxx11_,&node->unaryOperator_);
  this_00 = (Executor *)&stack0xffffffffffffffa8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa8,"unary operation ",__rhs);
  assertValueType(this_00,pVVar3,&stack0xffffffffffffffcc,(string *)&stack0xffffffffffffffa8,
                  (Node *)node);
  if ((_Map_pointer *)local_58 != &stack0xffffffffffffffb8) {
    operator_delete(local_58,(long)local_48 + 1);
  }
  local_58 = &PTR__ValueVisitor_001f52a8;
  local_50 = 0;
  local_40 = '\0';
  (*((this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
     super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
     super__Head_base<0UL,_Value_*,_false>._M_head_impl)->_vptr_Value[3])();
  if (local_40 != '\0') {
    local_68 = local_48;
    UVar1 = node->unaryOperator_;
    if (UVar1 == BinaryNegation) {
      local_68 = (_Map_pointer)(double)~(uint)(long)(double)local_48;
    }
    else if (UVar1 == Minus) {
      local_68 = (_Map_pointer)((ulong)local_48 ^ 0x8000000000000000);
    }
    else if (UVar1 == LogicalNot) {
      local_68 = (_Map_pointer)(-(ulong)((double)local_48 == 0.0) & 0x3ff0000000000000);
    }
    pVVar4 = (Value *)operator_new(0x18);
    pVVar4->valueType_ = F32;
    pVVar4->_vptr_Value = (_func_int **)&PTR__Value_001f51d0;
    *(undefined4 *)&pVVar4[1]._vptr_Value = (undefined4)local_68;
    *(undefined4 *)((long)&pVVar4[1]._vptr_Value + 4) = local_68._4_4_;
    pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = pVVar4;
    if (pVVar3 != (Value *)0x0) {
      (*pVVar3->_vptr_Value[1])();
    }
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::visit(const UnaryNode& node)
{
  node.getTerm().accept(*this);

  assertValueType(*value_, TypeName::F32,
    "unary operation " + UnaryOperationNames.at(node.getOperation()), node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  auto term = analyser.getValue().value();
  auto newValue = term;
  switch(node.getOperation())
  {
    case UnaryOperator::BinaryNegation:
      newValue = ~static_cast<unsigned int>(term);
      break;
    case UnaryOperator::LogicalNot:
      newValue = term == 0 ? 1 : 0;
      break;
    case UnaryOperator::Minus:
      newValue = -term;
      break;
  }

  value_ = std::make_unique<Number>(newValue);
}